

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O1

void brotli::StoreMetaBlockTrivial
               (uint8_t *input,size_t start_pos,size_t length,size_t mask,bool is_last,
               Command *commands,size_t n_commands,size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  uint uVar2;
  uint8_t *depth;
  uint16_t *bits;
  uint8_t *depth_00;
  uint16_t *bits_00;
  uint8_t *depth_01;
  uint16_t *bits_01;
  ulong uVar3;
  value_type_conflict3 *__val_3;
  value_type_conflict4 *__val_2;
  value_type_conflict3 *__val_1;
  value_type_conflict4 *__val;
  value_type_conflict4 *__val_4;
  HistogramLiteral lit_histo;
  HistogramCommand cmd_histo;
  HistogramDistance dist_histo;
  
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  memset(&lit_histo,0,0x408);
  lit_histo.bit_cost_ = INFINITY;
  memset(&cmd_histo,0,0xb08);
  cmd_histo.bit_cost_ = INFINITY;
  memset(&dist_histo,0,0x828);
  dist_histo.bit_cost_ = INFINITY;
  BuildHistograms(input,start_pos,mask,commands,n_commands,&lit_histo,&cmd_histo,&dist_histo);
  uVar1 = *storage_ix;
  uVar3 = uVar1 >> 3;
  *(ulong *)(storage + uVar3) = (ulong)storage[uVar3];
  *storage_ix = uVar1 + 0xd;
  depth = (uint8_t *)operator_new(0x100);
  memset(depth,0,0x100);
  bits = (uint16_t *)operator_new(0x200);
  memset(bits,0,0x200);
  depth_00 = (uint8_t *)operator_new(0x2c0);
  memset(depth_00,0,0x2c0);
  bits_00 = (uint16_t *)operator_new(0x580);
  memset(bits_00,0,0x580);
  depth_01 = (uint8_t *)operator_new(0x40);
  depth_01[0x30] = '\0';
  depth_01[0x31] = '\0';
  depth_01[0x32] = '\0';
  depth_01[0x33] = '\0';
  depth_01[0x34] = '\0';
  depth_01[0x35] = '\0';
  depth_01[0x36] = '\0';
  depth_01[0x37] = '\0';
  depth_01[0x38] = '\0';
  depth_01[0x39] = '\0';
  depth_01[0x3a] = '\0';
  depth_01[0x3b] = '\0';
  depth_01[0x3c] = '\0';
  depth_01[0x3d] = '\0';
  depth_01[0x3e] = '\0';
  depth_01[0x3f] = '\0';
  depth_01[0x20] = '\0';
  depth_01[0x21] = '\0';
  depth_01[0x22] = '\0';
  depth_01[0x23] = '\0';
  depth_01[0x24] = '\0';
  depth_01[0x25] = '\0';
  depth_01[0x26] = '\0';
  depth_01[0x27] = '\0';
  depth_01[0x28] = '\0';
  depth_01[0x29] = '\0';
  depth_01[0x2a] = '\0';
  depth_01[0x2b] = '\0';
  depth_01[0x2c] = '\0';
  depth_01[0x2d] = '\0';
  depth_01[0x2e] = '\0';
  depth_01[0x2f] = '\0';
  depth_01[0x10] = '\0';
  depth_01[0x11] = '\0';
  depth_01[0x12] = '\0';
  depth_01[0x13] = '\0';
  depth_01[0x14] = '\0';
  depth_01[0x15] = '\0';
  depth_01[0x16] = '\0';
  depth_01[0x17] = '\0';
  depth_01[0x18] = '\0';
  depth_01[0x19] = '\0';
  depth_01[0x1a] = '\0';
  depth_01[0x1b] = '\0';
  depth_01[0x1c] = '\0';
  depth_01[0x1d] = '\0';
  depth_01[0x1e] = '\0';
  depth_01[0x1f] = '\0';
  depth_01[0] = '\0';
  depth_01[1] = '\0';
  depth_01[2] = '\0';
  depth_01[3] = '\0';
  depth_01[4] = '\0';
  depth_01[5] = '\0';
  depth_01[6] = '\0';
  depth_01[7] = '\0';
  depth_01[8] = '\0';
  depth_01[9] = '\0';
  depth_01[10] = '\0';
  depth_01[0xb] = '\0';
  depth_01[0xc] = '\0';
  depth_01[0xd] = '\0';
  depth_01[0xe] = '\0';
  depth_01[0xf] = '\0';
  bits_01 = (uint16_t *)operator_new(0x80);
  bits_01[0x38] = 0;
  bits_01[0x39] = 0;
  bits_01[0x3a] = 0;
  bits_01[0x3b] = 0;
  bits_01[0x3c] = 0;
  bits_01[0x3d] = 0;
  bits_01[0x3e] = 0;
  bits_01[0x3f] = 0;
  bits_01[0x30] = 0;
  bits_01[0x31] = 0;
  bits_01[0x32] = 0;
  bits_01[0x33] = 0;
  bits_01[0x34] = 0;
  bits_01[0x35] = 0;
  bits_01[0x36] = 0;
  bits_01[0x37] = 0;
  bits_01[0x28] = 0;
  bits_01[0x29] = 0;
  bits_01[0x2a] = 0;
  bits_01[0x2b] = 0;
  bits_01[0x2c] = 0;
  bits_01[0x2d] = 0;
  bits_01[0x2e] = 0;
  bits_01[0x2f] = 0;
  bits_01[0x20] = 0;
  bits_01[0x21] = 0;
  bits_01[0x22] = 0;
  bits_01[0x23] = 0;
  bits_01[0x24] = 0;
  bits_01[0x25] = 0;
  bits_01[0x26] = 0;
  bits_01[0x27] = 0;
  bits_01[0x18] = 0;
  bits_01[0x19] = 0;
  bits_01[0x1a] = 0;
  bits_01[0x1b] = 0;
  bits_01[0x1c] = 0;
  bits_01[0x1d] = 0;
  bits_01[0x1e] = 0;
  bits_01[0x1f] = 0;
  bits_01[0x10] = 0;
  bits_01[0x11] = 0;
  bits_01[0x12] = 0;
  bits_01[0x13] = 0;
  bits_01[0x14] = 0;
  bits_01[0x15] = 0;
  bits_01[0x16] = 0;
  bits_01[0x17] = 0;
  bits_01[8] = 0;
  bits_01[9] = 0;
  bits_01[10] = 0;
  bits_01[0xb] = 0;
  bits_01[0xc] = 0;
  bits_01[0xd] = 0;
  bits_01[0xe] = 0;
  bits_01[0xf] = 0;
  bits_01[0] = 0;
  bits_01[1] = 0;
  bits_01[2] = 0;
  bits_01[3] = 0;
  bits_01[4] = 0;
  bits_01[5] = 0;
  bits_01[6] = 0;
  bits_01[7] = 0;
  BuildAndStoreHuffmanTree(lit_histo.data_,0x100,depth,bits,storage_ix,storage);
  BuildAndStoreHuffmanTree(cmd_histo.data_,0x2c0,depth_00,bits_00,storage_ix,storage);
  BuildAndStoreHuffmanTree(dist_histo.data_,0x40,depth_01,bits_01,storage_ix,storage);
  StoreDataWithHuffmanCodes
            (input,start_pos,mask,commands,n_commands,depth,bits,depth_00,bits_00,depth_01,bits_01,
             storage_ix,storage);
  if (is_last) {
    uVar2 = (int)*storage_ix + 7;
    *storage_ix = (ulong)(uVar2 & 0xfffffff8);
    storage[uVar2 >> 3] = '\0';
  }
  operator_delete(bits_01,0x80);
  operator_delete(depth_01,0x40);
  operator_delete(bits_00,0x580);
  operator_delete(depth_00,0x2c0);
  operator_delete(bits,0x200);
  operator_delete(depth,0x100);
  return;
}

Assistant:

void StoreMetaBlockTrivial(const uint8_t* input,
                           size_t start_pos,
                           size_t length,
                           size_t mask,
                           bool is_last,
                           const brotli::Command *commands,
                           size_t n_commands,
                           size_t *storage_ix,
                           uint8_t *storage) {
  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  HistogramLiteral lit_histo;
  HistogramCommand cmd_histo;
  HistogramDistance dist_histo;

  BuildHistograms(input, start_pos, mask, commands, n_commands,
                  &lit_histo, &cmd_histo, &dist_histo);

  WriteBits(13, 0, storage_ix, storage);

  std::vector<uint8_t> lit_depth(256);
  std::vector<uint16_t> lit_bits(256);
  std::vector<uint8_t> cmd_depth(kNumCommandPrefixes);
  std::vector<uint16_t> cmd_bits(kNumCommandPrefixes);
  std::vector<uint8_t> dist_depth(64);
  std::vector<uint16_t> dist_bits(64);

  BuildAndStoreHuffmanTree(&lit_histo.data_[0], 256,
                           &lit_depth[0], &lit_bits[0],
                           storage_ix, storage);
  BuildAndStoreHuffmanTree(&cmd_histo.data_[0], kNumCommandPrefixes,
                           &cmd_depth[0], &cmd_bits[0],
                           storage_ix, storage);
  BuildAndStoreHuffmanTree(&dist_histo.data_[0], 64,
                           &dist_depth[0], &dist_bits[0],
                           storage_ix, storage);
  StoreDataWithHuffmanCodes(input, start_pos, mask, commands,
                            n_commands, &lit_depth[0], &lit_bits[0],
                            &cmd_depth[0], &cmd_bits[0],
                            &dist_depth[0], &dist_bits[0],
                            storage_ix, storage);
  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}